

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inverse_kinematics.cpp
# Opt level: O1

int main(void)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  pointer pMVar5;
  int iVar6;
  time_t tVar7;
  ostream *poVar8;
  int i;
  long lVar9;
  pointer pMVar10;
  DenseBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_> *pDVar11;
  Matrix4d *pMVar12;
  byte bVar13;
  Vector6d theta;
  vector<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_std::allocator<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>_>
  theta_q;
  Matrix4d T;
  Matrix<double,_6,_1,_0,_6,_1> local_3b8;
  Matrix4d local_388;
  vector<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_std::allocator<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>_>
  local_308;
  double adStack_2f0 [17];
  Matrix4d local_268;
  Vector6d local_1e8;
  DenseBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_> local_1b8 [128];
  Matrix4d local_138;
  Matrix4d local_b8;
  
  bVar13 = 0;
  lVar9 = 0;
  tVar7 = time((time_t *)0x0);
  srand((uint)tVar7);
  do {
    iVar6 = rand();
    local_3b8.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
    [lVar9] = ((double)(iVar6 % 100) / 100.0) * 3.141592653589793;
    lVar9 = lVar9 + 1;
  } while (lVar9 != 6);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"theta: ",7);
  local_308.
  super__Vector_base<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_std::allocator<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>_>
  ._M_impl.super__Vector_impl_data._M_start = &local_3b8;
  poVar8 = Eigen::operator<<((ostream *)&std::cout,
                             (DenseBase<Eigen::Transpose<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>_> *)
                             &local_308);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
  std::ostream::put((char)poVar8);
  std::ostream::flush();
  local_1e8.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[0] =
       local_3b8.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
       [0];
  local_1e8.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[1] =
       local_3b8.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
       [1];
  local_1e8.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[2] =
       local_3b8.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
       [2];
  local_1e8.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[3] =
       local_3b8.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
       [3];
  local_1e8.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[4] =
       local_3b8.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
       [4];
  local_1e8.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[5] =
       local_3b8.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
       [5];
  forward_kinematics((Matrix4d *)local_1b8,&local_1e8);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"T:\n",3);
  poVar8 = Eigen::operator<<((ostream *)&std::cout,local_1b8);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
  std::ostream::put((char)poVar8);
  std::ostream::flush();
  transform(&local_268,1,
            local_3b8.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
            array[1]);
  transform(&local_388,2,
            local_3b8.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
            array[2]);
  transform(&local_b8,3,
            local_3b8.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
            array[3]);
  lVar9 = 0;
  do {
    dVar1 = *(double *)
             ((long)local_388.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage
                    .m_data.array + lVar9);
    dVar2 = *(double *)
             ((long)local_388.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage
                    .m_data.array + lVar9 + 8);
    dVar3 = *(double *)
             ((long)local_388.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage
                    .m_data.array + lVar9 + 0x10);
    dVar4 = *(double *)
             ((long)local_388.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage
                    .m_data.array + lVar9 + 0x18);
    *(double *)
     ((long)&local_308.
             super__Vector_base<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_std::allocator<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>_>
             ._M_impl.super__Vector_impl_data._M_start + lVar9) =
         local_268.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.
         array[0xc] * dVar4 +
         local_268.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.
         array[8] * dVar3 +
         local_268.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.
         array[4] * dVar2 +
         local_268.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.
         array[0] * dVar1;
    *(double *)((long)adStack_2f0 + lVar9 + -0x10) =
         local_268.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.
         array[0xd] * dVar4 +
         local_268.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.
         array[9] * dVar3 +
         local_268.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.
         array[5] * dVar2 +
         local_268.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.
         array[1] * dVar1;
    *(double *)((long)adStack_2f0 + lVar9 + -8) =
         dVar4 * local_268.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.
                 m_data.array[0xe] +
         dVar3 * local_268.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.
                 m_data.array[10] +
         dVar2 * local_268.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.
                 m_data.array[6] +
         dVar1 * local_268.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.
                 m_data.array[2];
    *(double *)((long)adStack_2f0 + lVar9) =
         dVar4 * local_268.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.
                 m_data.array[0xf] +
         dVar3 * local_268.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.
                 m_data.array[0xb] +
         dVar2 * local_268.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.
                 m_data.array[7] +
         dVar1 * local_268.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.
                 m_data.array[3];
    lVar9 = lVar9 + 0x20;
  } while (lVar9 != 0x80);
  pDVar11 = local_1b8;
  pMVar12 = &local_138;
  for (lVar9 = 0x10; lVar9 != 0; lVar9 = lVar9 + -1) {
    (pMVar12->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array
    [0] = *(double *)pDVar11;
    pDVar11 = pDVar11 + ((ulong)bVar13 * -2 + 1) * 8;
    pMVar12 = (Matrix4d *)((long)pMVar12 + ((ulong)bVar13 * -2 + 1) * 8);
  }
  inverse_kinematics(&local_308,&local_138);
  pMVar5 = local_308.
           super__Vector_base<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_std::allocator<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if ((long)local_308.
            super__Vector_base<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_std::allocator<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>_>
            ._M_impl.super__Vector_impl_data._M_finish -
      (long)local_308.
            super__Vector_base<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_std::allocator<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>_>
            ._M_impl.super__Vector_impl_data._M_start != 0) {
    lVar9 = ((long)local_308.
                   super__Vector_base<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_std::allocator<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)local_308.
                   super__Vector_base<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_std::allocator<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>_>
                   ._M_impl.super__Vector_impl_data._M_start >> 4) * -0x5555555555555555;
    lVar9 = lVar9 + (ulong)(lVar9 == 0);
    pMVar10 = local_308.
              super__Vector_base<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_std::allocator<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    do {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"theta_e: ",9);
      local_268.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array
      [0] = (double)pMVar10;
      poVar8 = Eigen::operator<<((ostream *)&std::cout,
                                 (DenseBase<Eigen::Transpose<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>_>
                                  *)&local_268);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
      std::ostream::put((char)poVar8);
      std::ostream::flush();
      pMVar10 = pMVar10 + 1;
      lVar9 = lVar9 + -1;
    } while (lVar9 != 0);
  }
  if (pMVar5 != (Matrix<double,_6,_1,_0,_6,_1> *)0x0) {
    operator_delete(pMVar5,(long)local_308.
                                 super__Vector_base<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_std::allocator<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)pMVar5);
  }
  return 0;
}

Assistant:

int main()
{

	srand(time(0));
	Vector6d theta;
	// theta <<  2.04204,  1.19381,  1.31947,  1.25664, 0.251327, 0.345575;
	for (int i = 0; i < 6; i++)
	{
		// theta(i) = 0;//i * M_PI / 2;
		theta(i) = rand() % 100 / 100.0 * M_PI;
	}

	cout << "theta: " << theta.transpose() << endl;

	Matrix4d T = forward_kinematics(theta);
	cout << "T:\n" << T << endl;
	Matrix4d T14 = transform(1, theta(1)) * transform(2, theta(2)) * transform(3, theta(3));
	vector<Vector6d> theta_q = inverse_kinematics(T);
	for(int i = 0; i < theta_q.size(); i++)
	{
		cout << "theta_e: " << theta_q[i].transpose() << endl;
	}
	return 0;
}